

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkInputAttachmentAspectReference * __thiscall
Fossilize::StateRecorder::Impl::copy<VkInputAttachmentAspectReference>
          (Impl *this,VkInputAttachmentAspectReference *src,size_t count,ScratchAllocator *alloc)

{
  VkInputAttachmentAspectReference *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkInputAttachmentAspectReference>(alloc,count);
    if (pVVar1 != (VkInputAttachmentAspectReference *)0x0) {
      pVVar1 = (VkInputAttachmentAspectReference *)memmove(pVVar1,src,count * 0xc);
      return pVVar1;
    }
  }
  return (VkInputAttachmentAspectReference *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}